

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadString(ON_BinaryArchive *this,ON_String *s)

{
  size_t string_utf8_element_count_00;
  bool bVar1;
  int iVar2;
  char *p;
  int istring_utf8_element_count;
  bool rc;
  size_t string_utf8_element_count;
  ON_String *s_local;
  ON_BinaryArchive *this_local;
  
  string_utf8_element_count = (size_t)s;
  s_local = (ON_String *)this;
  ON_String::Destroy(s);
  _istring_utf8_element_count = 0;
  bVar1 = ReadStringUTF8ElementCount(this,(size_t *)&istring_utf8_element_count);
  if ((bVar1) && (_istring_utf8_element_count != 0)) {
    iVar2 = (int)_istring_utf8_element_count;
    ON_String::ReserveArray((ON_String *)string_utf8_element_count,(long)iVar2);
    string_utf8_element_count_00 = _istring_utf8_element_count;
    p = ON_String::Array((ON_String *)string_utf8_element_count);
    ReadString(this,string_utf8_element_count_00,p);
    ON_String::SetLength((ON_String *)string_utf8_element_count,(long)(iVar2 + -1));
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadString( ON_String& s )
{
  s.Destroy();
  size_t string_utf8_element_count = 0;
  bool rc = ReadStringUTF8ElementCount( &string_utf8_element_count );
  if ( rc && string_utf8_element_count > 0 ) 
  {
    const int istring_utf8_element_count = (int)string_utf8_element_count; // (int) converts 64 bits size_t
    s.ReserveArray(istring_utf8_element_count);
    ReadString( string_utf8_element_count, s.Array() );
    s.SetLength( istring_utf8_element_count-1 );
  }
  return rc;
}